

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_session.c
# Opt level: O3

dlep_router_session *
dlep_router_add_session(dlep_router_if *interf,netaddr_socket *local,netaddr_socket *remote)

{
  dlep_session *session;
  list_entity *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int32_t iVar6;
  uint64_t uVar7;
  _Bool _Var8;
  _Bool _Var9;
  undefined2 uVar10;
  oonf_log_source oVar11;
  int iVar12;
  long lVar13;
  undefined8 uVar14;
  netaddr_socket *pnVar15;
  undefined8 uVar16;
  oonf_stream_session *poVar17;
  avl_tree *paVar18;
  dlep_router_session *pdVar19;
  netaddr_socket *pnVar20;
  netaddr_socket *pnVar21;
  ulong uVar22;
  list_entity *plVar23;
  byte bVar24;
  netaddr_str nbuf1;
  netaddr_str nbuf2;
  
  bVar24 = 0;
  paVar18 = &(interf->interf).session_tree;
  lVar13 = avl_find(paVar18,remote);
  if (lVar13 == 0) {
    pdVar19 = (dlep_router_session *)oonf_class_malloc(&_router_session_class);
    if (pdVar19 != (dlep_router_session *)0x0) {
      pnVar15 = &(pdVar19->session).remote_socket;
      pnVar20 = remote;
      pnVar21 = pnVar15;
      for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(undefined8 *)pnVar21 = *(undefined8 *)pnVar20;
        pnVar20 = (netaddr_socket *)((long)pnVar20 + (ulong)bVar24 * -0x10 + 8);
        pnVar21 = (netaddr_socket *)((long)pnVar21 + (ulong)bVar24 * -0x10 + 8);
      }
      (pdVar19->_node).key = pnVar15;
      (pdVar19->tcp).config.session_timeout = 120000;
      (pdVar19->tcp).config.maximum_input_buffer = 0x1000;
      (pdVar19->tcp).config.allowed_sessions = 3;
      (pdVar19->tcp).config.cleanup_session = _cb_tcp_lost;
      (pdVar19->tcp).config.cleanup_socket = _cb_socket_terminated;
      (pdVar19->tcp).config.receive_data = _cb_tcp_receive_data;
      oVar11 = LOG_DLEP_ROUTER;
      if (((&log_global_mask)[LOG_DLEP_ROUTER] & 1) != 0) {
        uVar14 = netaddr_socket_to_string(&nbuf1,local);
        uVar16 = netaddr_socket_to_string(&nbuf2,remote);
        oonf_log(1,oVar11,"src/generic/dlep/router/dlep_router_session.c",0x95,0,0,
                 "Connect DLEP session from %s to %s",uVar14,uVar16);
      }
      iVar12 = oonf_stream_add(&pdVar19->tcp,local);
      if (iVar12 == 0) {
        poVar17 = oonf_stream_connect_to(&pdVar19->tcp,remote);
        pdVar19->stream = poVar17;
        if (poVar17 == (oonf_stream_session *)0x0) {
          uVar22 = (ulong)LOG_DLEP_ROUTER;
          if (((&log_global_mask)[uVar22] & 4) != 0) {
            uVar14 = netaddr_socket_to_string(&nbuf1,local);
            uVar16 = netaddr_socket_to_string(&nbuf2,remote);
            oonf_log(4,uVar22,"src/generic/dlep/router/dlep_router_session.c",0xa2,0,0,
                     "Could not open TCP client on from %s to %s",uVar14,uVar16);
          }
        }
        else {
          session = &pdVar19->session;
          iVar12 = dlep_session_add(session,(interf->interf).l2_ifname,
                                    (interf->interf).session.l2_origin,
                                    (interf->interf).session.l2_default_origin,&poVar17->out,false,
                                    (_func_int_os_interface_listener_ptr *)0x0,LOG_DLEP_ROUTER);
          if (iVar12 == 0) {
            (pdVar19->session).restrict_signal = DLEP_SESSION_INITIALIZATION_ACK;
            (pdVar19->session).cb_send_buffer = _cb_send_buffer;
            (pdVar19->session).cb_end_session = _cb_end_session;
            uVar2 = *(undefined4 *)&(interf->interf).session.cfg.peer_type;
            uVar3 = *(undefined4 *)((long)&(interf->interf).session.cfg.peer_type + 4);
            uVar7 = (interf->interf).session.cfg.discovery_interval;
            uVar4 = *(undefined4 *)((long)&(interf->interf).session.cfg.discovery_interval + 4);
            uVar5 = *(undefined4 *)((long)&(interf->interf).session.cfg.heartbeat_interval + 4);
            _Var8 = (interf->interf).session.cfg.send_neighbors;
            _Var9 = (interf->interf).session.cfg.send_proxied;
            uVar10 = *(undefined2 *)&(interf->interf).session.cfg.field_0x1a;
            iVar6 = (interf->interf).session.cfg.lid_length;
            *(int *)&(pdVar19->session).cfg.heartbeat_interval =
                 (int)(interf->interf).session.cfg.heartbeat_interval;
            *(undefined4 *)((long)&(pdVar19->session).cfg.heartbeat_interval + 4) = uVar5;
            (pdVar19->session).cfg.send_neighbors = _Var8;
            (pdVar19->session).cfg.send_proxied = _Var9;
            *(undefined2 *)&(pdVar19->session).cfg.field_0x1a = uVar10;
            (pdVar19->session).cfg.lid_length = iVar6;
            *(undefined4 *)&(session->cfg).peer_type = uVar2;
            *(undefined4 *)((long)&(pdVar19->session).cfg.peer_type + 4) = uVar3;
            *(int *)&(pdVar19->session).cfg.discovery_interval = (int)uVar7;
            *(undefined4 *)((long)&(pdVar19->session).cfg.discovery_interval + 4) = uVar4;
            pdVar19->interface = interf;
            avl_insert(paVar18,&pdVar19->_node);
            paVar18 = dlep_extension_get_tree();
            for (plVar23 = (paVar18->list_head).next; plVar1 = plVar23->prev,
                paVar18 = dlep_extension_get_tree(), plVar1 != (paVar18->list_head).prev;
                plVar23 = plVar23->next) {
              if (plVar23[-4].prev != (list_entity *)0x0) {
                (*(code *)plVar23[-4].prev)(session);
              }
            }
            return pdVar19;
          }
        }
      }
      else {
        uVar22 = (ulong)LOG_DLEP_ROUTER;
        if (((&log_global_mask)[uVar22] & 4) != 0) {
          uVar14 = netaddr_socket_to_string(&nbuf1,local);
          oonf_log(4,uVar22,"src/generic/dlep/router/dlep_router_session.c",0x99,0,0,
                   "Could not open TCP client for local address %s",uVar14);
        }
      }
      dlep_router_remove_session(pdVar19);
    }
    pdVar19 = (dlep_router_session *)0x0;
  }
  else {
    pdVar19 = (dlep_router_session *)(lVar13 + -0x520);
    uVar22 = (ulong)LOG_DLEP_ROUTER;
    if (((&log_global_mask)[uVar22] & 1) != 0) {
      uVar14 = netaddr_socket_to_string(&nbuf1,remote);
      oonf_log(1,uVar22,"src/generic/dlep/router/dlep_router_session.c",0x7e,0,0,
               "use existing instance on %s for %s",(interf->interf).l2_ifname,uVar14);
    }
  }
  return pdVar19;
}

Assistant:

struct dlep_router_session *
dlep_router_add_session(struct dlep_router_if *interf, union netaddr_socket *local, union netaddr_socket *remote) {
  struct dlep_router_session *router_session;
  struct dlep_extension *ext;
  struct netaddr_str nbuf1, nbuf2;

  router_session = dlep_router_get_session(interf, remote);
  if (router_session) {
    OONF_DEBUG(LOG_DLEP_ROUTER,
      "use existing instance on"
      " %s for %s",
      interf->interf.l2_ifname, netaddr_socket_to_string(&nbuf1, remote));
    return router_session;
  }

  /* initialize tcp session instance */
  router_session = oonf_class_malloc(&_router_session_class);
  if (!router_session) {
    return NULL;
  }

  /* initialize tree node */
  memcpy(&router_session->session.remote_socket, remote, sizeof(*remote));
  router_session->_node.key = &router_session->session.remote_socket;

  /* configure and open TCP session */
  router_session->tcp.config.session_timeout = 120000; /* 120 seconds */
  router_session->tcp.config.maximum_input_buffer = 4096;
  router_session->tcp.config.allowed_sessions = 3;
  router_session->tcp.config.cleanup_session = _cb_tcp_lost;
  router_session->tcp.config.cleanup_socket = _cb_socket_terminated;
  router_session->tcp.config.receive_data = _cb_tcp_receive_data;

  OONF_DEBUG(LOG_DLEP_ROUTER, "Connect DLEP session from %s to %s", netaddr_socket_to_string(&nbuf1, local),
    netaddr_socket_to_string(&nbuf2, remote));

  if (oonf_stream_add(&router_session->tcp, local)) {
    OONF_WARN(
      LOG_DLEP_ROUTER, "Could not open TCP client for local address %s", netaddr_socket_to_string(&nbuf1, local));
    dlep_router_remove_session(router_session);
    return NULL;
  }

  /* open stream */
  router_session->stream = oonf_stream_connect_to(&router_session->tcp, remote);
  if (!router_session->stream) {
    OONF_WARN(LOG_DLEP_ROUTER, "Could not open TCP client on from %s to %s", netaddr_socket_to_string(&nbuf1, local),
      netaddr_socket_to_string(&nbuf2, remote));
    dlep_router_remove_session(router_session);
    return NULL;
  }

  if (dlep_session_add(&router_session->session, interf->interf.l2_ifname, interf->interf.session.l2_origin,
        interf->interf.session.l2_default_origin, &router_session->stream->out, false, NULL, LOG_DLEP_ROUTER)) {
    dlep_router_remove_session(router_session);
    return NULL;
  }
  router_session->session.restrict_signal = DLEP_SESSION_INITIALIZATION_ACK;
  router_session->session.cb_send_buffer = _cb_send_buffer;
  router_session->session.cb_end_session = _cb_end_session;
  memcpy(&router_session->session.cfg, &interf->interf.session.cfg, sizeof(router_session->session.cfg));

  /* initialize back pointer */
  router_session->interface = interf;

  /* add session to interface */
  avl_insert(&interf->interf.session_tree, &router_session->_node);

  /* inform all extensions */
  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (ext->cb_session_init_router) {
      ext->cb_session_init_router(&router_session->session);
    }
  }

  return router_session;
}